

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

xmlParserInputPtr xmlNewInputFromMemory(char *url,void *mem,size_t size,int flags)

{
  xmlParserInputBufferPtr buf_00;
  xmlParserInputBufferPtr buf;
  int flags_local;
  size_t size_local;
  void *mem_local;
  char *url_local;
  
  if (mem == (void *)0x0) {
    url_local = (char *)0x0;
  }
  else {
    buf_00 = xmlNewInputBufferMemory(mem,size,flags,XML_CHAR_ENCODING_NONE);
    if (buf_00 == (xmlParserInputBufferPtr)0x0) {
      url_local = (char *)0x0;
    }
    else {
      url_local = (char *)xmlNewInputInternal(buf_00,url);
    }
  }
  return (xmlParserInputPtr)url_local;
}

Assistant:

xmlParserInputPtr
xmlNewInputFromMemory(const char *url, const void *mem, size_t size,
                      int flags) {
    xmlParserInputBufferPtr buf;

    if (mem == NULL)
	return(NULL);

    buf = xmlNewInputBufferMemory(mem, size, flags, XML_CHAR_ENCODING_NONE);
    if (buf == NULL)
        return(NULL);

    return(xmlNewInputInternal(buf, url));
}